

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void NuttallWindow(int y_length,double *y)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)y_length;
  if (y_length < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    dVar3 = (double)(int)uVar2 / ((double)y_length + -1.0);
    dVar4 = cos(dVar3 * 6.283185307179586);
    dVar5 = cos(dVar3 * 12.566370614359172);
    dVar3 = cos(dVar3 * 18.84955592153876);
    y[uVar2] = dVar3 * -0.012604 + dVar5 * 0.144232 + dVar4 * -0.487396 + 0.355768;
  }
  return;
}

Assistant:

void NuttallWindow(int y_length, double *y) {
  double tmp;
  for (int i = 0; i < y_length; ++i) {
    tmp  = i / (y_length - 1.0);
    y[i] = 0.355768 - 0.487396 * cos(2.0 * world::kPi * tmp) +
      0.144232 * cos(4.0 * world::kPi * tmp) -
      0.012604 * cos(6.0 * world::kPi * tmp);
  }
}